

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_memcasecmp(void *s1,void *s2,size_t len)

{
  byte bVar1;
  size_t sVar2;
  
  sVar2 = 0;
  while( true ) {
    if (len == sVar2) {
      return 0;
    }
    bVar1 = *(byte *)((long)s1 + sVar2);
    if ((bVar1 != *(byte *)((long)s2 + sVar2)) &&
       (((*(byte *)((long)s2 + sVar2) ^ bVar1) != 0x20 || (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)))))
    break;
    sVar2 = sVar2 + 1;
  }
  return -1;
}

Assistant:

static int x509_memcasecmp(const void *s1, const void *s2, size_t len)
{
    size_t i;
    unsigned char diff;
    const unsigned char *n1 = s1, *n2 = s2;

    for (i = 0; i < len; i++) {
        diff = n1[i] ^ n2[i];

        if (diff == 0) {
            continue;
        }

        if (diff == 32 &&
            ((n1[i] >= 'a' && n1[i] <= 'z') ||
             (n1[i] >= 'A' && n1[i] <= 'Z'))) {
            continue;
        }

        return -1;
    }

    return 0;
}